

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.c
# Opt level: O2

int getPoIndex(Aig_Man_t *pAig,Aig_Obj_t *pPivot)

{
  Aig_Obj_t *pAVar1;
  int iVar2;
  int i;
  
  i = 0;
  while ((iVar2 = -1, i < pAig->nTruePos &&
         (pAVar1 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,i), iVar2 = i, pAVar1 != pPivot))) {
    i = i + 1;
  }
  return iVar2;
}

Assistant:

int getPoIndex( Aig_Man_t *pAig, Aig_Obj_t *pPivot )
{
	int i;
	Aig_Obj_t *pObj;

	Saig_ManForEachPo( pAig, pObj, i )
	{
		if( pObj == pPivot )
			return i;
	}
	return -1;
}